

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3f.cpp
# Opt level: O2

Vector3f __thiscall
Vector3f::cubicInterpolate
          (Vector3f *this,Vector3f *p0,Vector3f *p1,Vector3f *p2,Vector3f *p3,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector3f VVar5;
  Vector3f p2p3;
  Vector3f p1p2;
  Vector3f p0p1;
  Vector3f local_80;
  Vector3f local_70;
  Vector3f local_60;
  Vector3f local_50;
  Vector3f local_40;
  
  lerp(&local_40,p0,p1,t + 1.0);
  lerp(&local_50,p1,p2,t);
  lerp(&local_60,p2,p3,t + -1.0);
  fVar4 = (t + 1.0) * 0.5;
  fVar3 = t * 0.5;
  local_80.m_elements[2] =
       (local_60.m_elements[2] - local_50.m_elements[2]) * fVar3 + local_50.m_elements[2];
  local_70.m_elements[2] =
       (local_50.m_elements[2] - local_40.m_elements[2]) * fVar4 + local_40.m_elements[2];
  fVar1 = local_50.m_elements[0];
  fVar2 = local_50.m_elements[1];
  local_70.m_elements[0] = fVar4 * (fVar1 - local_40.m_elements[0]) + local_40.m_elements[0];
  local_70.m_elements[1] = fVar4 * (fVar2 - local_40.m_elements[1]) + local_40.m_elements[1];
  local_80.m_elements[1] = fVar3 * (local_60.m_elements[1] - fVar2) + fVar2;
  local_80.m_elements[0] = fVar3 * (local_60.m_elements[0] - fVar1) + fVar1;
  VVar5 = lerp(this,&local_70,&local_80,t);
  return (Vector3f)VVar5.m_elements;
}

Assistant:

Vector3f Vector3f::cubicInterpolate( const Vector3f& p0, const Vector3f& p1, const Vector3f& p2, const Vector3f& p3, float t )
{
	// geometric construction:
	//            t
	//   (t+1)/2     t/2
	// t+1        t	        t-1

	// bottom level
	Vector3f p0p1 = Vector3f::lerp( p0, p1, t + 1 );
	Vector3f p1p2 = Vector3f::lerp( p1, p2, t );
	Vector3f p2p3 = Vector3f::lerp( p2, p3, t - 1 );

	// middle level
	Vector3f p0p1_p1p2 = Vector3f::lerp( p0p1, p1p2, 0.5f * ( t + 1 ) );
	Vector3f p1p2_p2p3 = Vector3f::lerp( p1p2, p2p3, 0.5f * t );

	// top level
	return Vector3f::lerp( p0p1_p1p2, p1p2_p2p3, t );
}